

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

SequenceCatalogEntry * duckdb::BindSequence(Binder *binder,string *name)

{
  SequenceCatalogEntry *pSVar1;
  QualifiedName qname;
  QualifiedName local_70;
  
  QualifiedName::Parse(&local_70,name);
  pSVar1 = BindSequence(binder,&local_70.catalog,&local_70.schema,&local_70.name);
  QualifiedName::~QualifiedName(&local_70);
  return pSVar1;
}

Assistant:

SequenceCatalogEntry &BindSequence(Binder &binder, const string &name) {
	auto qname = QualifiedName::Parse(name);
	return BindSequence(binder, qname.catalog, qname.schema, qname.name);
}